

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dense.cpp
# Opt level: O2

void __thiscall
Dense::Dense(Dense *this,int input_size,int output_size,double *nlearning_rate,string *ntype)

{
  double *pdVar1;
  result_type rVar2;
  double dVar3;
  Index IVar4;
  Index IVar5;
  ulong uVar6;
  Scalar *pSVar7;
  int iVar8;
  int i_1;
  int i;
  long lVar9;
  int j;
  long col;
  default_random_engine generator;
  int local_a4;
  string *local_a0;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *local_98;
  double *local_90;
  string *local_88;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_80;
  int local_78;
  int local_74;
  double *local_70;
  Index local_68;
  Index IStack_60;
  normal_distribution<double> local_58;
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR_forward_00130928;
  local_98 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&this->biases;
  local_a0 = (string *)&this->type;
  (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->activation).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->activation).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->activation).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->last_input).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->last_input).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->last_input).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  local_a4 = output_size;
  local_90 = nlearning_rate;
  local_88 = ntype;
  local_74 = input_size;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_58,&local_74,&local_a4);
  pdVar1 = (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_58._M_param._M_mean;
  dVar3 = (double)(this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
  rVar2 = (result_type)
          (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols;
  (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = (Index)local_58._M_param._M_stddev;
  (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = (Index)local_58._M_saved;
  local_58._M_param._M_mean = (double)pdVar1;
  local_58._M_param._M_stddev = dVar3;
  local_58._M_saved = rVar2;
  free(pdVar1);
  uVar6 = std::chrono::_V2::system_clock::now();
  iVar8 = (int)((uVar6 & 0xffffffff) % 0x7fffffff);
  local_80._M_x = (unsigned_long)(iVar8 + (uint)(iVar8 == 0));
  local_58._M_param._M_mean = 0.0;
  local_58._M_param._M_stddev = 1.0;
  local_58._M_saved = 0.0;
  local_58._M_saved_available = false;
  for (lVar9 = 0;
      lVar9 < (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows; lVar9 = lVar9 + 1) {
    for (col = 0; col < (this->weigths).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols; col = col + 1) {
      rVar2 = std::normal_distribution<double>::operator()(&local_58,&local_80);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          &this->weigths,lVar9,col);
      *pSVar7 = rVar2;
    }
  }
  local_78 = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_70,&local_78,&local_a4);
  pdVar1 = (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data;
  (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_70;
  IVar4 = (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  IVar5 = (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_68;
  (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       IStack_60;
  local_70 = pdVar1;
  local_68 = IVar4;
  IStack_60 = IVar5;
  free(pdVar1);
  for (lVar9 = 0;
      lVar9 < (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols; lVar9 = lVar9 + 1) {
    rVar2 = std::normal_distribution<double>::operator()(&local_58,&local_80);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (local_98,0,lVar9);
    *pSVar7 = rVar2;
  }
  this->learning_rate = local_90;
  std::__cxx11::string::_M_assign(local_a0);
  return;
}

Assistant:

Dense::Dense(int input_size, int output_size, double* nlearning_rate, string ntype) {
    weigths = Eigen::MatrixXd(input_size, output_size);
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    std::default_random_engine generator (seed);
    std::normal_distribution<double> distribution(0.0,1.0);
    for(int i = 0; i < weigths.rows(); i++) {
        for(int j = 0; j < weigths.cols(); j++) {
            weigths(i,j) = distribution(generator);
        }
    }
    biases = Eigen::MatrixXd(1, output_size);
    for(int i = 0; i < biases.cols(); i++) {
        biases(0,i) = distribution(generator);
    }
    learning_rate = nlearning_rate;
    type = ntype;
}